

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void __thiscall StackSymbol::print(StackSymbol *this)

{
  pointer pdVar1;
  pointer piVar2;
  ostream *poVar3;
  ostream *poVar4;
  int i;
  long lVar5;
  
  switch(this->type_) {
  case kInt:
    poVar3 = std::operator<<((ostream *)&std::cout,"Int Value: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->value_).int_value);
    break;
  case kIntArray:
    poVar3 = (ostream *)&std::cout;
    std::operator<<((ostream *)&std::cout,"Int Array: ");
    for (lVar5 = 0;
        piVar2 = (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        lVar5 < (int)((ulong)((long)(this->value_).int_array.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
        lVar5 = lVar5 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,piVar2[lVar5]);
      std::operator<<(poVar4," ");
    }
    break;
  case kReal:
    std::operator<<((ostream *)&std::cout,"Real Value: ");
    poVar3 = std::ostream::_M_insert<double>((this->value_).real_value);
    break;
  case kRealArray:
    poVar3 = (ostream *)&std::cout;
    std::operator<<((ostream *)&std::cout,"Real Array: ");
    for (lVar5 = 0;
        pdVar1 = (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        lVar5 < (int)((ulong)((long)(this->value_).real_array.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
        lVar5 = lVar5 + 1) {
      poVar4 = std::ostream::_M_insert<double>(pdVar1[lVar5]);
      std::operator<<(poVar4," ");
    }
    break;
  default:
    goto switchD_00139b19_default;
  }
  std::endl<char,std::char_traits<char>>(poVar3);
switchD_00139b19_default:
  poVar3 = std::operator<<((ostream *)&std::cout,"===================================");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void StackSymbol::print() const {
    if (type_ == StackSymbol::Type::kInt) {
        std::cout << "Int Value: " << value_.int_value << std::endl;
    } else if (type_ == StackSymbol::Type::kIntArray) {
        std::cout << "Int Array: ";
        for (int i = 0; i < (int)value_.int_array.size(); i++) {
            std::cout << value_.int_array[i] << " ";
        }
        std::cout << std::endl;
    } else if (type_ == StackSymbol::Type::kReal) {
        std::cout << "Real Value: " << value_.real_value << std::endl;
    } else if (type_ == StackSymbol::Type::kRealArray) {
        std::cout << "Real Array: ";
        for (int i = 0; i < (int)value_.real_array.size(); i++) {
            std::cout << value_.real_array[i] << " ";
        }
        std::cout << std::endl;
    }
    std::cout << "===================================" << std::endl;
}